

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::InstanceSymbol::serializeTo(InstanceSymbol *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppPVar2;
  PortConnection *this_00;
  long lVar3;
  string_view name;
  string_view name_00;
  
  if (this->canonicalBody == (InstanceBodySymbol *)0x0) {
    ASTSerializer::write(serializer,4,"body",(size_t)this->body);
  }
  else {
    name._M_str = "body";
    name._M_len = 4;
    ASTSerializer::writeLink(serializer,name,&this->canonicalBody->super_Symbol);
  }
  name_00._M_str = "connections";
  name_00._M_len = 0xb;
  ASTSerializer::startArray(serializer,name_00);
  if (this->connectionMap == (PointerMap *)0x0) {
    resolvePortConnections(this);
  }
  sVar1 = (this->connections)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppPVar2 = (this->connections)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = *(PortConnection **)((long)ppPVar2 + lVar3);
      ASTSerializer::startObject(serializer);
      PortConnection::serializeTo(this_00,serializer);
      ASTSerializer::endObject(serializer);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void InstanceSymbol::serializeTo(ASTSerializer& serializer) const {
    if (canonicalBody)
        serializer.writeLink("body", *canonicalBody);
    else
        serializer.write("body", body);

    serializer.startArray("connections");
    for (auto conn : getPortConnections()) {
        serializer.startObject();
        conn->serializeTo(serializer);
        serializer.endObject();
    }
    serializer.endArray();
}